

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O2

Mat3x3d * __thiscall OpenMD::Atom::getI(Mat3x3d *__return_storage_ptr__,Atom *this)

{
  RectMatrix<double,_3U,_3U> RStack_58;
  
  SquareMatrix<double,_3>::identity();
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)__return_storage_ptr__,&RStack_58);
  return __return_storage_ptr__;
}

Assistant:

Mat3x3d Atom::getI() { return Mat3x3d::identity(); }